

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lzop.c
# Opt level: O0

void test_write_filter_lzop(void)

{
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  archive *paVar6;
  void *buff_00;
  void *__ptr;
  char *pcVar7;
  la_ssize_t lVar8;
  la_int64_t lVar9;
  int filecount;
  int use_prog;
  int r;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  
  bVar1 = false;
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'*',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_add_filter_lzop(paVar6);
  iVar4 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  if (iVar3 != 0) {
    wVar5 = canLzop();
    if ((wVar5 == L'\0') || (iVar3 != -0x14)) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'1');
      test_skipping("lzop writing not supported on this platform");
      return;
    }
    bVar1 = true;
  }
  buff_00 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'7',(uint)(buff_00 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  path[8] = '\x10';
  path[9] = '\'';
  path[10] = '\0';
  path[0xb] = '\0';
  path[0xc] = '\0';
  path[0xd] = '\0';
  path[0xe] = '\0';
  path[0xf] = '\0';
  __ptr = calloc(10000,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L':',(uint)(__ptr != (void *)0x0),"NULL != (data = calloc(datasize, 1))",
                   (void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'@',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_ustar(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar6);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'C',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_set_bytes_per_block(paVar6,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 1024)",
                      paVar6);
  iVar3 = archive_write_set_bytes_in_last_block(paVar6,0x400);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_bytes_in_last_block(a, 1024)",paVar6);
  iVar3 = archive_filter_code(paVar6,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'H',0xb,"ARCHIVE_FILTER_LZOP",(long)iVar3,"archive_filter_code(a, 0)",
                      (void *)0x0);
  pcVar7 = archive_filter_name(paVar6,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
             ,L'I',"lzop","\"lzop\"",pcVar7,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  iVar3 = archive_write_open_memory(paVar6,buff_00,2000000,&used2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used1)",paVar6);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'L',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_filetype((archive_entry *)a,0x8000);
  archive_entry_set_size((archive_entry *)a,path._8_8_);
  for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
    snprintf((char *)&used1,0x10,"file%03d");
    archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
    iVar3 = archive_write_header(paVar6,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'R',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
    uVar2 = path._8_8_;
    lVar8 = archive_write_data(paVar6,__ptr,path._8_8_);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'T',(uint)(uVar2 == lVar8),
                     "datasize == (size_t)archive_write_data(a, data, datasize)",paVar6);
  }
  archive_entry_free((archive_entry *)a);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'W',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'X',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Z',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar6);
  iVar3 = archive_read_support_filter_lzop(paVar6);
  if ((iVar3 != -0x14) || (bVar1)) {
    iVar3 = archive_read_open_memory(paVar6,buff_00,used2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used1)",
                        paVar6);
    for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
      snprintf((char *)&used1,0x10,"file%03d",(ulong)(uint)use_prog);
      iVar3 = archive_read_next_header(paVar6,(archive_entry **)&a);
      wVar5 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'f',0,"ARCHIVE_OK",(long)iVar3,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar5 == L'\0') break;
      pcVar7 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'h',(char *)&used1,"path",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar3 = (int)path._8_8_;
      lVar9 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'i',(long)iVar3,"(int)datasize",lVar9,"archive_entry_size(ae)",
                          (void *)0x0);
    }
    iVar3 = archive_read_close(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'k',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'^');
    test_skipping(
                 "Can\'t verify lzop writing by reading back; lzop reading not fully supported on this platform"
                 );
  }
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L's',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_ustar(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L't',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar6);
  iVar3 = archive_write_set_bytes_per_block(paVar6,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 10)",
                      paVar6);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'x',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_set_options(paVar6,"lzop:nonexistent-option=0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'z',-0x19,"ARCHIVE_FAILED",(long)iVar3,
                      "archive_write_set_options(a, \"lzop:nonexistent-option=0\")",paVar6);
  iVar3 = archive_write_set_options(paVar6,"lzop:compression-level=1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"lzop:compression-level=1\")",paVar6);
  iVar3 = archive_write_set_filter_option(paVar6,(char *)0x0,"compression-level","9");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")",
                      paVar6);
  iVar3 = archive_write_set_filter_option(paVar6,(char *)0x0,"compression-level","abc");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x80',-0x19,"ARCHIVE_FAILED",(long)iVar3,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")",
                      paVar6);
  iVar3 = archive_write_set_filter_option(paVar6,(char *)0x0,"compression-level","99");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x82',-0x19,"ARCHIVE_FAILED",(long)iVar3,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                      paVar6);
  iVar3 = archive_write_set_options(paVar6,"lzop:compression-level=9");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"lzop:compression-level=9\")",paVar6);
  iVar3 = archive_write_open_memory(paVar6,buff_00,2000000,(size_t *)&r);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x86',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar6);
  for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
    snprintf((char *)&used1,0x10,"file%03d",(ulong)(uint)use_prog);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'\x89',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
    archive_entry_set_size((archive_entry *)a,path._8_8_);
    archive_entry_set_filetype((archive_entry *)a,0x8000);
    iVar3 = archive_write_header(paVar6,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'\x8d',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
    uVar2 = path._8_8_;
    lVar8 = archive_write_data(paVar6,__ptr,path._8_8_);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'\x8f',(uint)(uVar2 == lVar8),
                     "datasize == (size_t)archive_write_data( a, data, datasize)",paVar6);
    archive_entry_free((archive_entry *)a);
  }
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x93',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  failure("compression-level=9 wrote %d bytes, default wrote %d bytes",_r & 0xffffffff,
          used2 & 0xffffffff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x97',(uint)(_r < used2),"used2 < used1",(void *)0x0);
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x99',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",
                      paVar6);
  iVar3 = archive_read_support_filter_lzop(paVar6);
  if ((iVar3 == 0) || (bVar1)) {
    iVar3 = archive_read_support_filter_all(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'\xa0',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",
                        paVar6);
    iVar3 = archive_read_open_memory(paVar6,buff_00,_r);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'¢',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used2)"
                        ,paVar6);
    for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
      snprintf((char *)&used1,0x10,"file%03d",(ulong)(uint)use_prog);
      iVar3 = archive_read_next_header(paVar6,(archive_entry **)&a);
      wVar5 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'¦',0,"ARCHIVE_OK",(long)iVar3,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar5 == L'\0') break;
      pcVar7 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'¨',(char *)&used1,"path",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
      ;
      iVar3 = (int)path._8_8_;
      lVar9 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'©',(long)iVar3,"(int)datasize",lVar9,"archive_entry_size(ae)",
                          (void *)0x0);
    }
    iVar3 = archive_read_close(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'\x9d');
    test_skipping("lzop reading not fully supported on this platform");
  }
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'²',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_ustar(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'³',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar6);
  iVar3 = archive_write_set_bytes_per_block(paVar6,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'µ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 10)",
                      paVar6);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'·',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_set_filter_option(paVar6,(char *)0x0,"compression-level","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")",
                      paVar6);
  iVar3 = archive_write_open_memory(paVar6,buff_00,2000000,(size_t *)&r);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'»',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar6);
  for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
    snprintf((char *)&used1,0x10,"file%03d",(ulong)(uint)use_prog);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                     ,L'¾',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
    archive_entry_set_size((archive_entry *)a,path._8_8_);
    archive_entry_set_filetype((archive_entry *)a,0x8000);
    iVar3 = archive_write_header(paVar6,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Â',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
    failure("Writing file %s",&used1);
    uVar2 = path._8_8_;
    lVar8 = archive_write_data(paVar6,__ptr,path._8_8_);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Å',uVar2,"datasize",lVar8,
                        "(size_t)archive_write_data(a, data, datasize)",paVar6);
    archive_entry_free((archive_entry *)a);
  }
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'É',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Ñ',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_read_support_format_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ò',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar6)
  ;
  iVar3 = archive_read_support_filter_all(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ó',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",paVar6)
  ;
  iVar3 = archive_read_support_filter_lzop(paVar6);
  if ((iVar3 != -0x14) || (bVar1)) {
    iVar3 = archive_read_open_memory(paVar6,buff_00,_r);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'Ù',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used2)"
                        ,paVar6);
    for (use_prog = 0; use_prog < 10; use_prog = use_prog + 1) {
      snprintf((char *)&used1,0x10,"file%03d",(ulong)(uint)use_prog);
      iVar3 = archive_read_next_header(paVar6,(archive_entry **)&a);
      wVar5 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                                  ,L'Ý',0,"ARCHIVE_OK",(long)iVar3,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar5 == L'\0') break;
      pcVar7 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                 ,L'ß',(char *)&used1,"path",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
      ;
      iVar3 = (int)path._8_8_;
      lVar9 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                          ,L'à',(long)iVar3,"(int)datasize",lVar9,"archive_entry_size(ae)",
                          (void *)0x0);
    }
    iVar3 = archive_read_close(paVar6);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                        ,L'â',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar6);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'Ö');
    test_skipping("lzop reading not fully supported on this platform");
  }
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ê',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ì',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'í',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ï',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ñ',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ó',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'õ',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_ustar(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar6);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ø',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ù',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ú',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                   ,L'ü',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_ustar(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ý',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar6);
  iVar3 = 0;
  if (bVar1) {
    iVar3 = -0x14;
  }
  iVar4 = archive_write_add_filter_lzop(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ÿ',(long)iVar3,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)iVar4,
                      "archive_write_add_filter_lzop(a)",paVar6);
  iVar3 = archive_write_open_memory(paVar6,buff_00,2000000,(size_t *)&r);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ā',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used2)",paVar6);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_lzop.c"
                      ,L'ă',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  free(__ptr);
  free(buff_00);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lzop)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0, filecount;

	assert((a = archive_write_new()) != NULL);
	r = archive_write_add_filter_lzop(a);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	if (r != ARCHIVE_OK) {
		if (canLzop() && r == ARCHIVE_WARN)
			use_prog = 1;
		else {
			skipping("lzop writing not supported on this platform");
			return;
		}
	}

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = calloc(datasize, 1)));
	filecount = 10;

	/*
	 * Write a filecount files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 1024));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_in_last_block(a, 1024));
	assertEqualInt(ARCHIVE_FILTER_LZOP, archive_filter_code(a, 0));
	assertEqualString("lzop", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r == ARCHIVE_WARN && !use_prog) {
		skipping("Can't verify lzop writing by reading back;"
		    " lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "lzop:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lzop:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "lzop:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(
		    a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < filecount; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

#if 0
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
#endif

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r == ARCHIVE_WARN && !use_prog) {
		skipping("lzop reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < filecount; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_lzop(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}